

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

Vec_Int_t * Gia_ManPoXSim(Gia_Man_t *p,int nFrames,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  char *__format;
  byte bVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong local_50;
  
  uVar18 = (long)p->vCos->nSize - (long)p->nRegs;
  local_50 = uVar18 & 0xffffffff;
  iVar12 = (int)uVar18;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar17 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar17 = iVar12;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar17;
  if (iVar17 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar17 << 2);
  }
  pVVar6->pArray = piVar7;
  if (iVar17 < iVar12) {
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(uVar18 * 4);
    }
    else {
      piVar7 = (int *)realloc(piVar7,uVar18 * 4);
    }
    pVVar6->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar6->nCap = iVar12;
  }
  if (0 < iVar12) {
    piVar7 = pVVar6->pArray;
    uVar11 = 0;
    do {
      piVar7[uVar11] = nFrames;
      uVar11 = uVar11 + 1;
    } while ((uVar18 & 0xffffffff) != uVar11);
  }
  pVVar6->nSize = iVar12;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
  iVar17 = p->nRegs;
  if (0 < iVar17) {
    iVar5 = 0;
    do {
      iVar2 = p->vCos->nSize;
      uVar16 = (iVar2 - iVar17) + iVar5;
      if (((int)uVar16 < 0) || (iVar2 <= (int)uVar16)) {
LAB_0078c600:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar17 = p->vCos->pArray[uVar16];
      lVar9 = (long)iVar17;
      if ((lVar9 < 0) || (p->nObjs <= iVar17)) {
LAB_0078c5e1:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar4 + lVar9) = *(ulong *)(pGVar4 + lVar9) & 0xbfffffffbfffffff | 0x40000000;
      iVar5 = iVar5 + 1;
      iVar17 = p->nRegs;
    } while (iVar5 < iVar17);
  }
  if (nFrames < 1) {
    uVar18 = 1;
  }
  else {
    iVar17 = 0;
    uVar11 = 0;
    if (0 < iVar12) {
      uVar11 = uVar18 & 0xffffffff;
    }
    do {
      pVVar8 = p->vCis;
      uVar18 = (ulong)(uint)pVVar8->nSize;
      if (p->nRegs < pVVar8->nSize) {
        lVar9 = 0;
        do {
          if ((int)uVar18 <= lVar9) goto LAB_0078c600;
          iVar12 = pVVar8->pArray[lVar9];
          if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_0078c5e1;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar12;
          *(ulong *)pGVar4 = *(ulong *)pGVar4 | 0x4000000040000000;
          lVar9 = lVar9 + 1;
          pVVar8 = p->vCis;
          uVar18 = (ulong)pVVar8->nSize;
        } while (lVar9 < (long)(uVar18 - (long)p->nRegs));
      }
      iVar12 = p->nRegs;
      if (0 < iVar12) {
        iVar5 = 0;
        do {
          iVar2 = p->vCis->nSize;
          uVar16 = iVar5 + (iVar2 - iVar12);
          if (((int)uVar16 < 0) || (iVar2 <= (int)uVar16)) goto LAB_0078c600;
          iVar3 = p->vCis->pArray[uVar16];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0078c5e1;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar4 + iVar3;
          uVar18 = *(ulong *)pGVar1;
          if (((~(uint)uVar18 & 0x9fffffff) != 0) ||
             (uVar16 = (uint)(uVar18 >> 0x20) & 0x1fffffff, (int)uVar16 < iVar2 - iVar12)) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar12 = p->vCos->nSize;
          uVar16 = (iVar12 - iVar2) + uVar16;
          if (((int)uVar16 < 0) || (iVar12 <= (int)uVar16)) goto LAB_0078c600;
          iVar12 = p->vCos->pArray[uVar16];
          lVar9 = (long)iVar12;
          if ((lVar9 < 0) || (p->nObjs <= iVar12)) goto LAB_0078c5e1;
          if ((*(ulong *)(pGVar4 + lVar9) & 0x4000000040000000) == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x356,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar13 = *(ulong *)(pGVar4 + lVar9) & 0x40000000;
          *(ulong *)pGVar1 = uVar18 & 0xffffffffbfffffff | uVar13;
          *(ulong *)pGVar1 =
               uVar18 & 0xbfffffffbfffffff | uVar13 |
               *(ulong *)(pGVar4 + lVar9) & 0x4000000000000000;
          iVar5 = iVar5 + 1;
          iVar12 = p->nRegs;
        } while (iVar5 < iVar12);
      }
      if (0 < p->nObjs) {
        lVar9 = 0;
        lVar10 = 0;
        do {
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar18 = *(ulong *)(&pGVar4->field_0x0 + lVar9);
          uVar16 = (uint)uVar18;
          if ((uVar18 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar16) {
            uVar13 = *(ulong *)((long)pGVar4 +
                               lVar9 + (ulong)(uint)((int)(uVar18 & 0x1fffffff) << 2) * -3) &
                     0x4000000040000000;
            if (uVar13 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x33e,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar14 = *(ulong *)((long)pGVar4 +
                               lVar9 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3) &
                     0x4000000040000000;
            if (uVar14 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x33f,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            if ((((((uVar16 >> 0x1d & 1) == 0) || (uVar13 != 0x4000000000000000)) &&
                 (((uVar16 >> 0x1d & 1) != 0 || (uVar13 != 0x40000000)))) &&
                (((uVar18 >> 0x3d & 1) == 0 || (uVar14 != 0x4000000000000000)))) &&
               (((uVar18 >> 0x3d & 1) != 0 || (uVar14 != 0x40000000)))) {
              if ((((byte)(uVar18 >> 0x1d) & 1 & uVar13 == 0x40000000) != 0) ||
                 ((uVar18 >> 0x1d & 1) == 0 && uVar13 == 0x4000000000000000)) {
                bVar15 = (byte)(uVar18 >> 0x3d) & 1;
                if (((bVar15 & uVar14 == 0x40000000) != 0) ||
                   (bVar15 == 0 && uVar14 == 0x4000000000000000)) {
                  uVar18 = (uVar18 & 0xbfffffff3fffffff) + 0x4000000000000000;
                  goto LAB_0078c285;
                }
              }
              uVar18 = uVar18 | 0x4000000040000000;
            }
            else {
              uVar18 = uVar18 & 0xbfffffff3fffffff | 0x40000000;
            }
LAB_0078c285:
            *(ulong *)(&pGVar4->field_0x0 + lVar9) = uVar18;
          }
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 0xc;
        } while (lVar10 < p->nObjs);
      }
      pVVar8 = p->vCos;
      if (0 < pVVar8->nSize) {
        lVar9 = 0;
        do {
          iVar12 = pVVar8->pArray[lVar9];
          if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_0078c5e1;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar12;
          uVar18 = *(ulong *)pGVar4;
          uVar16 = (uint)uVar18;
          if ((-1 < (int)uVar16) || ((uVar16 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x349,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          uVar13 = *(ulong *)(pGVar4 + -(ulong)(uVar16 & 0x1fffffff)) & 0x4000000040000000;
          if (uVar13 == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x34a,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          if ((((uVar16 >> 0x1d & 1) == 0) || (uVar13 != 0x4000000000000000)) &&
             (((uVar16 >> 0x1d & 1) != 0 || (uVar13 != 0x40000000)))) {
            if ((((byte)(uVar18 >> 0x1d) & 1 & uVar13 == 0x40000000) == 0) &&
               ((uVar18 >> 0x1d & 1) != 0 || uVar13 != 0x4000000000000000)) {
              uVar18 = uVar18 | 0x4000000040000000;
            }
            else {
              uVar18 = (uVar18 & 0xbfffffffbfffffff) + 0x4000000000000000;
            }
          }
          else {
            uVar18 = uVar18 & 0xbfffffffbfffffff | 0x40000000;
          }
          *(ulong *)pGVar4 = uVar18;
          lVar9 = lVar9 + 1;
          pVVar8 = p->vCos;
        } while (lVar9 < pVVar8->nSize);
      }
      if (fVerbose != 0) {
        pVVar8 = p->vCos;
        uVar18 = (ulong)(uint)pVVar8->nSize;
        if (p->nRegs < pVVar8->nSize) {
          lVar9 = 0;
          do {
            if ((int)uVar18 <= lVar9) goto LAB_0078c600;
            iVar12 = pVVar8->pArray[lVar9];
            if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_0078c5e1;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            uVar18 = *(ulong *)(p->pObjs + iVar12);
            iVar12 = 0x30;
            if ((uVar18 & 0x4000000040000000) == 0x40000000) {
LAB_0078c4a0:
              putchar(iVar12);
            }
            else {
              iVar12 = 0x31;
              if ((((uVar18 >> 0x3e & 1) == 0 | (byte)(uVar18 >> 0x1e) & 1) != 1) ||
                 (iVar12 = 0x58, (((uint)uVar18 & (uint)(uVar18 >> 0x20)) >> 0x1e & 1) == 1))
              goto LAB_0078c4a0;
            }
            lVar9 = lVar9 + 1;
            pVVar8 = p->vCos;
            uVar18 = (ulong)pVVar8->nSize;
          } while (lVar9 < (long)(uVar18 - (long)p->nRegs));
        }
        putchar(10);
      }
      pVVar8 = p->vCos;
      uVar18 = (ulong)(uint)pVVar8->nSize;
      if (p->nRegs < pVVar8->nSize) {
        uVar13 = 0;
        do {
          if ((long)(int)uVar18 <= (long)uVar13) goto LAB_0078c600;
          iVar12 = pVVar8->pArray[uVar13];
          if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_0078c5e1;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar11 == uVar13) goto LAB_0078c600;
          if ((pVVar6->pArray[uVar13] == nFrames) &&
             ((~*(ulong *)(p->pObjs + iVar12) & 0x4000000040000000) == 0)) {
            pVVar6->pArray[uVar13] = iVar17;
            local_50 = (ulong)((int)local_50 - 1);
          }
          uVar13 = uVar13 + 1;
          uVar18 = (ulong)pVVar8->nSize;
        } while ((long)uVar13 < (long)(uVar18 - (long)p->nRegs));
      }
      if ((int)local_50 == 0) {
        iVar12 = 0;
        goto LAB_0078c5a1;
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 != nFrames);
    iVar12 = 1;
    iVar17 = nFrames;
LAB_0078c5a1:
    uVar18 = (ulong)(iVar17 + 1);
  }
  if (fVerbose != 0) {
    if (iVar12 == 0) {
      __format = "Simulation converged after %d frames.\n";
    }
    else {
      __format = "Simulation terminated after %d frames.\n";
      uVar18 = (ulong)(uint)nFrames;
    }
    printf(__format,uVar18);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Gia_ManPoXSim( Gia_Man_t * p, int nFrames, int fVerbose )
{
    Vec_Int_t * vRes;
    Gia_Obj_t * pObj;
    int f, k, nLeft = Gia_ManPoNum(p);
    vRes = Vec_IntAlloc( Gia_ManPoNum(p) );
    Vec_IntFill( vRes, Gia_ManPoNum(p), nFrames );
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            Gia_ObjTerSimSetX( pObj );
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
        if ( fVerbose )
        {
            Gia_ManForEachPo( p, pObj, k )
                Gia_ObjTerSimPrint( pObj );
            printf( "\n" );
        }
        Gia_ManForEachPo( p, pObj, k )
            if ( Vec_IntEntry(vRes, k) == nFrames && Gia_ObjTerSimGetX(pObj) )
                Vec_IntWriteEntry(vRes, k, f), nLeft--;
        if ( nLeft == 0 )
            break;
    }
    if ( fVerbose )
    {
        if ( nLeft == 0 )
            printf( "Simulation converged after %d frames.\n", f+1 );
        else
            printf( "Simulation terminated after %d frames.\n", nFrames );
    }        
//    Vec_IntPrint( vRes );
    return vRes;
}